

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype
               (DynamicObject *asyncGeneratorFunctionPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  ScriptContext *this_01;
  ScriptConfiguration *pSVar3;
  undefined4 *puVar4;
  RuntimeFunction **ppRVar5;
  DynamicObject **ppDVar6;
  JavascriptString *value;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *asyncGeneratorFunctionPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,asyncGeneratorFunctionPrototype,mode,3,0);
  this = RecyclableObject::GetLibrary(&asyncGeneratorFunctionPrototype->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  this_01 = GetScriptContext(this);
  pSVar3 = ScriptContext::GetConfig(this_01);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(pSVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb78,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).asyncGeneratorFunctionConstructor);
  AddMember(this,asyncGeneratorFunctionPrototype,0x67,*ppRVar5,'\x02');
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).asyncGeneratorPrototype);
  AddMember(this,asyncGeneratorFunctionPrototype,0x124,*ppDVar6,'\x02');
  pSVar3 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES6ToStringTagEnabled(pSVar3);
  if (bVar2) {
    value = CreateStringFromCppLiteral<23ul>(this,(char16 (*) [23])L"AsyncGeneratorFunction");
    AddMember(this,asyncGeneratorFunctionPrototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(asyncGeneratorFunctionPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype(DynamicObject* asyncGeneratorFunctionPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(asyncGeneratorFunctionPrototype, mode, 3);
        JavascriptLibrary* library = asyncGeneratorFunctionPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());

        library->AddMember(asyncGeneratorFunctionPrototype, PropertyIds::constructor, library->asyncGeneratorFunctionConstructor, PropertyConfigurable);
        library->AddMember(asyncGeneratorFunctionPrototype, PropertyIds::prototype, library->asyncGeneratorPrototype, PropertyConfigurable);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(asyncGeneratorFunctionPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("AsyncGeneratorFunction")), PropertyConfigurable);
        }
        asyncGeneratorFunctionPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }